

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void __thiscall Helper::GenerateCorrelatedRandoms(Helper *this,int n)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  ulong uVar4;
  int i;
  size_type __n;
  ulong uVar5;
  allocator_type local_280 [8];
  ofstream fout;
  time_t local_80;
  time_t t;
  vector<long,_std::allocator<long>_> R;
  vector<long,_std::allocator<long>_> R1;
  vector<long,_std::allocator<long>_> R2;
  
  __n = (size_type)n;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &R.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__n,local_280);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__n,local_280);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&t,__n,local_280);
  std::ofstream::ofstream(local_280);
  tVar2 = time(&local_80);
  srand((uint)tVar2);
  uVar5 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = rand();
    R.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[uVar5] = (long)(iVar1 % 10000);
    iVar1 = rand();
    R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[uVar5] = (long)(iVar1 % 10000);
    iVar1 = rand();
    *(long *)(t + uVar5 * 8) = (long)(iVar1 % 10000);
  }
  std::ofstream::open((char *)local_280,0x105014);
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    poVar3 = std::ostream::_M_insert<long>((long)local_280);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<long>((long)local_280);
    std::operator<<(poVar3,"\n");
  }
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::open((char *)local_280,0x105035);
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    poVar3 = std::ostream::_M_insert<long>((long)local_280);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<long>((long)local_280);
    std::operator<<(poVar3,"\n");
  }
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::~ofstream(local_280);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&t);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)
             &R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)
             &R.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void Helper::GenerateCorrelatedRandoms(int n)
{
    std::vector<long> R1(n);
    std::vector<long> R2(n);
    std::vector<long> R(n);
    std::ofstream fout;
    time_t t;
    srand((unsigned)time(&t));

    for (int i = 0; i < n; i++)
    {
        R1[i] = rand()%10000;
        R2[i] = rand()%10000;
        R[i] = rand()%10000;
    }
    fout.open("../randoms/alice/Randoms_A.txt");
    for (int i = 0; i < n; i++)
    {
        fout << R1[i] << " ";
        fout << R1[i] * R2[i] + R[i] << "\n";
    }
    fout.flush();
    fout.close();
    fout.open("../randoms/bob/Randoms_B.txt");
    for (int i = 0; i < n; i++)
    {
        fout << R2[i] << " ";
        fout << R1[i] * R2[i] - R[i] << "\n";
    }
    fout.flush();
    fout.close();
}